

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t b_insert(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ion_bpp_key_t *piVar1;
  ion_bpp_node_t *piVar2;
  bool bVar3;
  char cVar4;
  ion_bpp_err_t iVar5;
  int iVar6;
  int iVar7;
  ion_bpp_err_t unaff_EBP;
  ion_bpp_address_t iVar8;
  ion_bpp_buffer_t *pbuf;
  ion_bpp_h_node_t *h;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_key_t *local_88;
  int local_7c;
  ion_bpp_buffer_t *local_78;
  uint local_6c;
  ion_bpp_external_address_t local_68;
  ion_bpp_address_t local_60;
  ion_bpp_buffer_t *local_58 [5];
  
  pbuf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  local_68 = rec;
  if (*(int *)((long)handle + 0xb8) * 3 == (uint)(**(ushort **)((long)handle + 0x38) >> 1)) {
    memcpy(*(void **)((long)handle + 0x98),*(ushort **)((long)handle + 0x38),
           (long)*(int *)((long)handle + 0x10) * 3);
    **(ushort **)((long)handle + 0x98) =
         (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x98) & 0xfffe |
         **(ushort **)((long)handle + 0x38) & 1;
    **(ushort **)((long)handle + 0x38) = **(ushort **)((long)handle + 0x38) & 1;
    iVar5 = scatter(handle,pbuf,(ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,local_58)
    ;
    if (iVar5 != bErrOk) {
      return iVar5;
    }
  }
  local_6c = 0;
  local_7c = 0;
  iVar7 = 0;
  do {
    if ((undefined1  [40])((undefined1  [40])*pbuf->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      if (maxHeight < iVar7) {
        maxHeight = iVar7;
      }
      iVar7 = search(handle,pbuf,key,local_68,&local_88,MODE_MATCH);
      if (iVar7 == 1) {
        if ((*(int *)((long)handle + 0xc) == 0) &&
           (cVar4 = (**(code **)((long)handle + 0x18))
                              (key,local_88,*(undefined4 *)((long)handle + 8)), cVar4 == '\0')) {
          return bErrDupKeys;
        }
        local_88 = local_88 + *(int *)((long)handle + 0xbc);
      }
      else {
        if (iVar7 == 0) {
          return bErrDupKeys;
        }
        if ((((iVar7 == -1) && (*(int *)((long)handle + 0xc) == 0)) && (1 < *(ushort *)pbuf->p)) &&
           (cVar4 = (**(code **)((long)handle + 0x18))
                              (key,local_88,*(undefined4 *)((long)handle + 8)), cVar4 == '\0')) {
          return bErrDupKeys;
        }
      }
      piVar1 = local_88;
      iVar6 = ((int)local_88 - (int)pbuf->p) + -0x20;
      iVar7 = (uint)(*(ushort *)pbuf->p >> 1) * *(int *)((long)handle + 0xbc) - iVar6;
      if (iVar7 != 0) {
        memmove(local_88 + *(int *)((long)handle + 0xbc),local_88,(long)iVar7);
      }
      memcpy(piVar1,key,(long)*(int *)((long)handle + 8));
      iVar7 = *(int *)((long)handle + 8);
      *(ion_bpp_external_address_t *)(piVar1 + iVar7) = local_68;
      piVar1 = piVar1 + (long)iVar7 + 8;
      piVar1[0] = '\0';
      piVar1[1] = '\0';
      piVar1[2] = '\0';
      piVar1[3] = '\0';
      piVar1[4] = '\0';
      piVar1[5] = '\0';
      piVar1[6] = '\0';
      piVar1[7] = '\0';
      *(short *)pbuf->p = *(short *)pbuf->p + 2;
      pbuf->valid = boolean_true;
      pbuf->modified = boolean_true;
      if ((iVar6 == 0) && (local_7c != 0)) {
        iVar5 = readDisk(handle,local_60,&local_78);
        if (iVar5 != bErrOk) {
          return iVar5;
        }
        piVar2 = local_78->p;
        memcpy(&piVar2->fkey,key,(long)*(int *)((long)handle + 8));
        *(ion_bpp_external_address_t *)(&piVar2->fkey + *(int *)((long)handle + 8)) = local_68;
        local_78->valid = boolean_true;
        local_78->modified = boolean_true;
      }
      nKeysIns = nKeysIns + 1;
      return bErrOk;
    }
    iVar6 = search(handle,pbuf,key,local_68,&local_88,MODE_MATCH);
    if (iVar6 < 0) {
      iVar8 = *(ion_bpp_address_t *)(local_88 + -8);
    }
    else {
      iVar8 = *(ion_bpp_address_t *)(local_88 + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar5 = readDisk(handle,iVar8,&local_78);
    if (iVar5 == bErrOk) {
      if (*(uint *)((long)handle + 0xb8) == (uint)(*(ushort *)local_78->p >> 1)) {
        iVar5 = gather(handle,pbuf,&local_88,local_58);
        if ((iVar5 == bErrOk) && (iVar5 = scatter(handle,pbuf,local_88,3,local_58), iVar5 == bErrOk)
           ) {
          iVar6 = search(handle,pbuf,key,local_68,&local_88,MODE_MATCH);
          if (iVar6 < 0) {
            iVar8 = *(ion_bpp_address_t *)(local_88 + -8);
          }
          else {
            iVar8 = *(ion_bpp_address_t *)(local_88 + (long)*(int *)((long)handle + 8) + 8);
          }
          iVar5 = readDisk(handle,iVar8,&local_78);
          if (iVar5 == bErrOk) goto LAB_0010a71d;
        }
        goto LAB_0010a66f;
      }
LAB_0010a71d:
      if ((iVar6 < 0) && (local_88 == &pbuf->p->fkey)) {
        if (local_6c != 0) {
          local_7c = 1;
        }
        local_6c = (uint)(local_6c != 0);
      }
      else {
        local_60 = pbuf->adr;
        local_7c = 0;
        local_6c = 1;
      }
      bVar3 = true;
      pbuf = local_78;
    }
    else {
LAB_0010a66f:
      bVar3 = false;
      unaff_EBP = iVar5;
    }
    iVar7 = iVar7 + 1;
    if (!bVar3) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

ion_bpp_err_t
b_insert(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to insertion point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */

					if (!h->dupKeys && (0 != ct(buf)) && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					break;

				case ION_CC_EQ:	/* key = mkey */
					return bErrDupKeys;
					break;

				case ION_CC_GT:	/* key > mkey */

					if (!h->dupKeys && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					mkey += ks(1);
					break;
			}

			/* shift items GE key to right */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf)) - keyOff;

			if (len) {
				memmove(mkey + ks(1), mkey, len);
			}

			/* insert new key */
			memcpy(key(mkey), key, h->keySize);
			rec(mkey)		= rec;
			childGE(mkey)	= 0;
			ct(buf)++;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if new key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				/* tkey = fkey(tbuf) + lastGEkey; */
				tkey		= fkey(tbuf);
				memcpy(key(tkey), key, h->keySize);
				rec(tkey)	= rec;

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysIns++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}